

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

st_ptls_key_schedule_t * key_schedule_new(ptls_hash_algorithm_t *algo)

{
  st_ptls_key_schedule_t *__ptr;
  ptls_hash_context_t *ppVar1;
  
  __ptr = (st_ptls_key_schedule_t *)malloc(0x58);
  if (__ptr != (st_ptls_key_schedule_t *)0x0) {
    ppVar1 = (*algo->create)();
    if (ppVar1 != (ptls_hash_context_t *)0x0) {
      __ptr->secret[0x2c] = '\0';
      __ptr->secret[0x2d] = '\0';
      __ptr->secret[0x2e] = '\0';
      __ptr->secret[0x2f] = '\0';
      __ptr->secret[0x30] = '\0';
      __ptr->secret[0x31] = '\0';
      __ptr->secret[0x32] = '\0';
      __ptr->secret[0x33] = '\0';
      __ptr->secret[0x34] = '\0';
      __ptr->secret[0x35] = '\0';
      __ptr->secret[0x36] = '\0';
      __ptr->secret[0x37] = '\0';
      __ptr->secret[0x38] = '\0';
      __ptr->secret[0x39] = '\0';
      __ptr->secret[0x3a] = '\0';
      __ptr->secret[0x3b] = '\0';
      __ptr->secret[0x1c] = '\0';
      __ptr->secret[0x1d] = '\0';
      __ptr->secret[0x1e] = '\0';
      __ptr->secret[0x1f] = '\0';
      __ptr->secret[0x20] = '\0';
      __ptr->secret[0x21] = '\0';
      __ptr->secret[0x22] = '\0';
      __ptr->secret[0x23] = '\0';
      __ptr->secret[0x24] = '\0';
      __ptr->secret[0x25] = '\0';
      __ptr->secret[0x26] = '\0';
      __ptr->secret[0x27] = '\0';
      __ptr->secret[0x28] = '\0';
      __ptr->secret[0x29] = '\0';
      __ptr->secret[0x2a] = '\0';
      __ptr->secret[0x2b] = '\0';
      __ptr->secret[0xc] = '\0';
      __ptr->secret[0xd] = '\0';
      __ptr->secret[0xe] = '\0';
      __ptr->secret[0xf] = '\0';
      __ptr->secret[0x10] = '\0';
      __ptr->secret[0x11] = '\0';
      __ptr->secret[0x12] = '\0';
      __ptr->secret[0x13] = '\0';
      __ptr->secret[0x14] = '\0';
      __ptr->secret[0x15] = '\0';
      __ptr->secret[0x16] = '\0';
      __ptr->secret[0x17] = '\0';
      __ptr->secret[0x18] = '\0';
      __ptr->secret[0x19] = '\0';
      __ptr->secret[0x1a] = '\0';
      __ptr->secret[0x1b] = '\0';
      __ptr->generation = 0;
      __ptr->secret[0] = '\0';
      __ptr->secret[1] = '\0';
      __ptr->secret[2] = '\0';
      __ptr->secret[3] = '\0';
      __ptr->secret[4] = '\0';
      __ptr->secret[5] = '\0';
      __ptr->secret[6] = '\0';
      __ptr->secret[7] = '\0';
      __ptr->secret[8] = '\0';
      __ptr->secret[9] = '\0';
      __ptr->secret[10] = '\0';
      __ptr->secret[0xb] = '\0';
      *(undefined8 *)(__ptr->secret + 0x3c) = 0;
      __ptr->algo = algo;
      __ptr->msghash = ppVar1;
      return __ptr;
    }
    free(__ptr);
  }
  return (st_ptls_key_schedule_t *)0x0;
}

Assistant:

static struct st_ptls_key_schedule_t *key_schedule_new(ptls_hash_algorithm_t *algo)
{
    struct st_ptls_key_schedule_t *sched = NULL;
    ptls_hash_context_t *hash = NULL;

    if ((sched = malloc(sizeof(*sched))) == NULL)
        return NULL;
    if ((hash = algo->create()) == NULL) {
        free(sched);
        return NULL;
    }

    *sched = (struct st_ptls_key_schedule_t){algo, hash};
    return sched;
}